

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

nifti_1_header * nifti_make_new_header(int *arg_dims,int arg_dtype)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  nifti_1_header *pnVar4;
  int swapsize;
  int nbyper;
  int local_20;
  int local_1c;
  
  if (arg_dims == (int *)0x0) {
    arg_dims = &DAT_0011c070;
  }
  uVar1 = *arg_dims;
  if (uVar1 - 8 < 0xfffffff9) {
    fprintf(_stderr,"** nifti_simple_hdr_with_dims: bad dim[0]=%d\n");
    arg_dims = &DAT_0011c070;
  }
  else if (0 < (int)uVar1) {
    uVar3 = 1;
    do {
      if ((int)((uint *)arg_dims)[uVar3] < 1) {
        fprintf(_stderr,"** nifti_simple_hdr_with_dims: bad dim[%d]=%d\n",uVar3 & 0xffffffff);
        arg_dims = &DAT_0011c070;
        break;
      }
      uVar3 = uVar3 + 1;
    } while ((ulong)uVar1 + 1 != uVar3);
  }
  iVar2 = nifti_is_valid_datatype(arg_dtype);
  if (iVar2 == 0) {
    fprintf(_stderr,"** nifti_simple_hdr_with_dims: bad dtype %d\n",arg_dtype);
    arg_dtype = 0x10;
  }
  if (1 < g_opts_0) {
    fprintf(_stderr,"+d nifti_make_new_header, dim[0] = %d, datatype = %d\n",(ulong)(uint)*arg_dims)
    ;
  }
  pnVar4 = (nifti_1_header *)calloc(1,0x15c);
  if (pnVar4 == (nifti_1_header *)0x0) {
    nifti_make_new_header_cold_1();
    pnVar4 = (nifti_1_header *)0x0;
  }
  else {
    pnVar4->sizeof_hdr = 0x15c;
    pnVar4->regular = 'r';
    uVar1 = *arg_dims;
    pnVar4->dim[0] = (short)uVar1;
    pnVar4->pixdim[0] = 0.0;
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pnVar4->dim[uVar3 + 1] = (short)((uint *)arg_dims)[uVar3 + 1];
        pnVar4->pixdim[uVar3 + 1] = 1.0;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    pnVar4->datatype = (short)arg_dtype;
    nifti_datatype_sizes((int)(short)arg_dtype,&local_1c,&local_20);
    pnVar4->bitpix = (short)(local_1c << 3);
    builtin_strncpy(pnVar4->magic,"n+1",4);
  }
  return pnVar4;
}

Assistant:

nifti_1_header * nifti_make_new_header(const int arg_dims[], int arg_dtype)
{
   nifti_1_header * nhdr;
   const int        default_dims[8] = { 3, 1, 1, 1, 0, 0, 0, 0 };
   const int      * dim;  /* either passed or default dims  */
   int              dtype; /* either passed or default dtype */
   int              c, nbyper, swapsize;

   /* if arg_dims is passed, apply it */
   if( arg_dims ) dim = arg_dims;
   else           dim = default_dims;

   /* validate dim: if there is any problem, apply default_dims */
   if( dim[0] < 1 || dim[0] > 7 ) {
      fprintf(stderr,"** nifti_simple_hdr_with_dims: bad dim[0]=%d\n",dim[0]);
      dim = default_dims;
   } else {
      for( c = 1; c <= dim[0]; c++ )
         if( dim[c] < 1 )
         {
            fprintf(stderr,
                "** nifti_simple_hdr_with_dims: bad dim[%d]=%d\n",c,dim[c]);
            dim = default_dims;
            break;
         }
   }

   /* validate dtype, too */
   dtype = arg_dtype;
   if( ! nifti_is_valid_datatype(dtype) ) {
      fprintf(stderr,"** nifti_simple_hdr_with_dims: bad dtype %d\n",dtype);
      dtype = DT_FLOAT32;
   }

   /* now populate the header struct */

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d nifti_make_new_header, dim[0] = %d, datatype = %d\n",
              dim[0], dtype);

   nhdr = (nifti_1_header *)calloc(1,sizeof(nifti_1_header));
   if( !nhdr ){
      fprintf(stderr,"** nifti_make_new_header: failed to alloc hdr\n");
      return NULL;
   }

   nhdr->sizeof_hdr = sizeof(nifti_1_header) ;
   nhdr->regular    = 'r' ;           /* for some stupid reason */

   /* init dim and pixdim */
   nhdr->dim[0] = dim[0] ;
   nhdr->pixdim[0] = 0.0f;
   for( c = 1; c <= dim[0]; c++ ) {
      nhdr->dim[c] = dim[c];
      nhdr->pixdim[c] = 1.0f;
   }

   nhdr->datatype = dtype ;
   nifti_datatype_sizes( nhdr->datatype , &nbyper, &swapsize );
   nhdr->bitpix   = 8 * nbyper ;

   strcpy(nhdr->magic, "n+1");  /* init to single file */

   return nhdr;
}